

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qslider.cpp
# Opt level: O2

void __thiscall QSliderPrivate::resetLayoutItemMargins(QSliderPrivate *this)

{
  undefined8 uVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  undefined8 *puVar5;
  QStyleOptionSlider *pQVar6;
  long in_FS_OFFSET;
  QStyleOptionSlider opt;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  plVar3 = *(long **)&(this->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x8;
  puVar5 = &DAT_00661f50;
  pQVar6 = &opt;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    uVar1 = *puVar5;
    (pQVar6->super_QStyleOptionComplex).super_QStyleOption.version = (int)uVar1;
    (pQVar6->super_QStyleOptionComplex).super_QStyleOption.type = (int)((ulong)uVar1 >> 0x20);
    puVar5 = puVar5 + 1;
    pQVar6 = (QStyleOptionSlider *)&(pQVar6->super_QStyleOptionComplex).super_QStyleOption.state;
  }
  QStyleOptionSlider::QStyleOptionSlider(&opt);
  (**(code **)(*plVar3 + 0x1a8))(plVar3,&opt);
  QWidgetPrivate::setLayoutItemMargins
            ((QWidgetPrivate *)this,SE_SliderLayoutItem,(QStyleOption *)&opt);
  QStyleOption::~QStyleOption((QStyleOption *)&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSliderPrivate::resetLayoutItemMargins()
{
    Q_Q(QSlider);
    QStyleOptionSlider opt;
    // ### This is (also) reached from the ctor which is unfortunate since a possible
    // ### re-implementation of initStyleOption is then not called.
    q->initStyleOption(&opt);
    setLayoutItemMargins(QStyle::SE_SliderLayoutItem, &opt);
}